

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O1

void dg::DOD::constructTernaryRelation
               (ColoredAp *CAp,CDNode *p,ResultT *CD,ResultT *revCD,CDNode *b2,CDNode *b3,CDNode *r1
               ,CDNode *r2)

{
  pointer ppCVar1;
  bool bVar2;
  _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
  *p_Var3;
  CDNode *apnode;
  CDNode *gncur;
  CDNode *gcur;
  CDNode *local_48;
  CDNode *local_40;
  CDNode *local_38;
  
  local_38 = p;
  while( true ) {
    local_40 = ColoredAp::getGNode(CAp,b2);
    apnode = r2;
    do {
      local_48 = ColoredAp::getGNode(CAp,apnode);
      p_Var3 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                *)std::
                  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  ::operator[](CD,&local_40);
      std::
      _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
      ::_M_insert_unique<dg::CDNode*const&>(p_Var3,&local_38);
      p_Var3 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                *)std::
                  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  ::operator[](CD,&local_48);
      std::
      _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
      ::_M_insert_unique<dg::CDNode*const&>(p_Var3,&local_38);
      p_Var3 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                *)std::
                  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  ::operator[](revCD,&local_38);
      std::
      _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
      ::_M_insert_unique<dg::CDNode*const&>(p_Var3,&local_40);
      p_Var3 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                *)std::
                  map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  ::operator[](revCD,&local_38);
      std::
      _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
      ::_M_insert_unique<dg::CDNode*const&>(p_Var3,&local_48);
      ppCVar1 = (apnode->super_ElemWithEdges<dg::CDNode>)._successors.
                super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((long)ppCVar1 -
          (long)(apnode->super_ElemWithEdges<dg::CDNode>)._successors.
                super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                super__Vector_impl_data._M_start == 8) {
        apnode = ppCVar1[-1];
      }
      else {
        apnode = (CDNode *)0x0;
      }
      bVar2 = ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
              ::get(&CAp->blues,(ulong)apnode->_id);
    } while ((!bVar2) &&
            (bVar2 = ADT::
                     SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                     ::get(&CAp->reds,(ulong)apnode->_id), !bVar2));
    ppCVar1 = (b2->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)ppCVar1 -
        (long)(b2->super_ElemWithEdges<dg::CDNode>)._successors.
              super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      b2 = ppCVar1[-1];
    }
    else {
      b2 = (CDNode *)0x0;
    }
    bVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
            ::get(&CAp->blues,(ulong)b2->_id);
    if (bVar2) break;
    bVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
            ::get(&CAp->reds,(ulong)b2->_id);
    if (bVar2) {
      return;
    }
  }
  return;
}

Assistant:

static void constructTernaryRelation(ColoredAp &CAp, CDNode *p, ResultT &CD,
                                         ResultT &revCD, CDNode *b2, CDNode *b3,
                                         CDNode *r1, CDNode *r2) {
        auto *cur = b2;
        do {
            auto *gcur = CAp.getGNode(cur);
            assert(gcur);

            auto *ncur = r2;
            do {
                auto *gncur = CAp.getGNode(ncur);
                assert(gncur);
                // DBG(cda, p->getID() << " - dod -> {" << gcur->getID() << ", "
                //                                     << gncur->getID() <<
                //                                     "}");

                CD[gcur].insert(p);
                CD[gncur].insert(p);
                revCD[p].insert(gcur);
                revCD[p].insert(gncur);

                ncur = ncur->getSingleSuccessor();
            } while (!(CAp.isBlue(ncur) || CAp.isRed(ncur)));
            assert(ncur == b3);
            (void) b3;

            cur = cur->getSingleSuccessor();
        } while (!(CAp.isBlue(cur) || CAp.isRed(cur)));
        assert(cur == r1);
        (void) r1;
    }